

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

void __thiscall cfd::core::Pubkey::Pubkey(Pubkey *this,string *hex_string)

{
  ByteData local_28;
  
  ByteData::ByteData(&local_28,hex_string);
  Pubkey(this,&local_28);
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Pubkey::Pubkey(const std::string &hex_string) : Pubkey(ByteData(hex_string)) {
  // do nothing
}